

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int yymatchClass(GREG *G,uchar *bits,char *cclass)

{
  int iVar1;
  
  iVar1 = G->pos;
  if (G->limit <= iVar1) {
    iVar1 = yyrefill(G);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = G->pos;
  }
  if ((bits[(byte)G->buf[iVar1] >> 3] >> ((byte)G->buf[iVar1] & 7) & 1) == 0) {
    return 0;
  }
  G->pos = iVar1 + 1;
  return 1;
}

Assistant:

YY_LOCAL(int) yymatchClass(GREG *G, const unsigned char *bits, const char *cclass)
{
  int c;
  if (G->pos >= G->limit && !yyrefill(G)) return 0;
  c= (unsigned char)G->buf[G->pos];
  if (bits[c >> 3] & (1 << (c & 7)))
    {
      ++G->pos;
      yyprintf((stderr, "  ok   yymatchClass [%s]", cclass));
      yyprintfGcontext;
      yyprintf((stderr, "\n"));
      return 1;
    }
  yyprintfv((stderr, "  fail yymatchClass [%s]", cclass));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));
  return 0;
}